

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

void do_pop_up_error_proc(Am_Object param_1)

{
  ostrstream oss;
  char line [250];
  ostrstream local_270 [360];
  char local_108 [256];
  
  std::ostrstream::ostrstream(local_270,local_108,0xfa,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_270,"This is an error message",0x18);
  std::ostream::put((char)local_270);
  Am_Pop_Up_Error_Window(local_108);
  std::ostrstream::~ostrstream(local_270);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_pop_up_error, (Am_Object /*cmd*/))
{
  AM_POP_UP_ERROR_WINDOW("This is an error message");
}